

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::MessageLite::InternalSerializeWithCachedSizesToArray
          (MessageLite *this,bool deterministic,uint8 *target)

{
  int size;
  LogMessage *other;
  LogFinisher local_a1;
  CodedOutputStream coded_out;
  ArrayOutputStream out;
  LogMessage local_60;
  
  size = (*this->_vptr_MessageLite[0xf])();
  io::ArrayOutputStream::ArrayOutputStream(&out,target,size,-1);
  io::CodedOutputStream::CodedOutputStream(&coded_out,&out.super_ZeroCopyOutputStream);
  coded_out.serialization_deterministic_is_overridden_ = true;
  coded_out.serialization_deterministic_override_ = deterministic;
  (*this->_vptr_MessageLite[0xd])(this);
  if (coded_out.had_error_ == true) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0xef);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: !coded_out.HadError(): ");
    internal::LogFinisher::operator=(&local_a1,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  io::CodedOutputStream::~CodedOutputStream(&coded_out);
  io::ArrayOutputStream::~ArrayOutputStream(&out);
  return target + size;
}

Assistant:

uint8* MessageLite::InternalSerializeWithCachedSizesToArray(
    bool deterministic, uint8* target) const {
  // We only optimize this when using optimize_for = SPEED.  In other cases
  // we just use the CodedOutputStream path.
  int size = GetCachedSize();
  io::ArrayOutputStream out(target, size);
  io::CodedOutputStream coded_out(&out);
  coded_out.SetSerializationDeterministic(deterministic);
  SerializeWithCachedSizes(&coded_out);
  GOOGLE_CHECK(!coded_out.HadError());
  return target + size;
}